

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O1

void sys_unqueuegui(void *client)

{
  t_guiqueue *fatso;
  void *pvVar1;
  t_guiqueue *ptVar2;
  bool bVar3;
  
  fatso = (pd_maininstance.pd_inter)->i_guiqueuehead;
  bVar3 = fatso == (t_guiqueue *)0x0;
  if (!bVar3) {
    pvVar1 = fatso->gq_client;
    while (pvVar1 == client) {
      (pd_maininstance.pd_inter)->i_guiqueuehead = fatso->gq_next;
      freebytes(fatso,0x20);
      fatso = (pd_maininstance.pd_inter)->i_guiqueuehead;
      bVar3 = fatso == (t_guiqueue *)0x0;
      if (bVar3) {
        return;
      }
      pvVar1 = fatso->gq_client;
    }
    if (!bVar3) {
      while (ptVar2 = fatso, fatso = ptVar2->gq_next, fatso != (_guiqueue *)0x0) {
        if (fatso->gq_client == client) {
          ptVar2->gq_next = fatso->gq_next;
          freebytes(fatso,0x20);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void sys_unqueuegui(void *client)
{
    t_guiqueue *gq, *gq2;
    while (INTER->i_guiqueuehead && INTER->i_guiqueuehead->gq_client == client)
    {
        gq = INTER->i_guiqueuehead;
        INTER->i_guiqueuehead = INTER->i_guiqueuehead->gq_next;
        t_freebytes(gq, sizeof(*gq));
    }
    if (!INTER->i_guiqueuehead)
        return;
    for (gq = INTER->i_guiqueuehead; (gq2 = gq->gq_next); gq = gq2)
        if (gq2->gq_client == client)
        {
            gq->gq_next = gq2->gq_next;
            t_freebytes(gq2, sizeof(*gq2));
            break;
        }
}